

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

string * cmsys::Encoding::ToNarrow(string *__return_storage_ptr__,wstring *str)

{
  size_t sVar1;
  ulong uVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  string local_60;
  long local_30;
  size_t nullPos;
  size_t pos;
  wstring *local_18;
  wstring *str_local;
  string *nstr;
  
  pos._7_1_ = 0;
  local_18 = str;
  str_local = (wstring *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  nullPos = 0;
  local_30 = 0;
  do {
    sVar1 = nullPos;
    uVar2 = std::__cxx11::wstring::size();
    if ((sVar1 < uVar2) &&
       (piVar3 = (int *)std::__cxx11::wstring::at((ulong)local_18), *piVar3 != 0)) {
      auVar4 = std::__cxx11::wstring::c_str();
      ToNarrow_abi_cxx11_(&local_60,(Encoding *)(auVar4._0_8_ + nullPos * 4),auVar4._8_8_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    local_30 = std::__cxx11::wstring::find((wchar_t)local_18,0);
    if (local_30 != -1) {
      nullPos = local_30 + 1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\0');
    }
  } while (local_30 != -1);
  return __return_storage_ptr__;
}

Assistant:

std::string Encoding::ToNarrow(const std::wstring& str)
{
  std::string nstr;
#  if defined(_WIN32)
  int length =
    WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.c_str(),
                        int(str.size()), nullptr, 0, nullptr, nullptr);
  if (length > 0) {
    char* data = new char[length];
    int r =
      WideCharToMultiByte(KWSYS_ENCODING_DEFAULT_CODEPAGE, 0, str.c_str(),
                          int(str.size()), data, length, nullptr, nullptr);
    if (r > 0) {
      nstr = std::string(data, length);
    }
    delete[] data;
  }
#  else
  size_t pos = 0;
  size_t nullPos = 0;
  do {
    if (pos < str.size() && str.at(pos) != '\0') {
      nstr += ToNarrow(str.c_str() + pos);
    }
    nullPos = str.find(wchar_t('\0'), pos);
    if (nullPos != std::string::npos) {
      pos = nullPos + 1;
      nstr += '\0';
    }
  } while (nullPos != std::string::npos);
#  endif
  return nstr;
}